

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O2

int Io_WriteBenchLut(Abc_Ntk_t *pNtk,char *pFileName)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  char *pcVar8;
  Vec_Int_t *vTruth;
  int *piVar9;
  ProgressBar *p;
  uint *Sign;
  ulong uVar10;
  char *pString;
  ulong uVar11;
  size_t __size;
  
  if ((pNtk->ntkFunc != ABC_FUNC_AIG) || (pNtk->ntkType != ABC_NTK_NETLIST)) {
    __assert_fail("Abc_NtkIsAigNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                  ,0xb3,"int Io_WriteBenchLut(Abc_Ntk_t *, char *)");
  }
  iVar3 = Io_WriteBenchCheckNames(pNtk);
  if (iVar3 == 0) {
    pcVar8 = 
    "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n"
    ;
    __size = 0x93;
  }
  else {
    __stream = fopen(pFileName,"w");
    if (__stream != (FILE *)0x0) {
      pcVar8 = pNtk->pName;
      pcVar6 = Extra_TimeStamp();
      fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar8,pcVar6);
      for (iVar3 = 0; iVar3 < pNtk->vPis->nSize; iVar3 = iVar3 + 1) {
        pAVar7 = Abc_NtkPi(pNtk,iVar3);
        pcVar8 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray]);
        fprintf(__stream,"INPUT(%s)\n",pcVar8);
      }
      for (iVar3 = 0; iVar3 < pNtk->vPos->nSize; iVar3 = iVar3 + 1) {
        pAVar7 = Abc_NtkPo(pNtk,iVar3);
        pcVar8 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray]);
        fprintf(__stream,"OUTPUT(%s)\n",pcVar8);
      }
      for (iVar3 = 0; iVar3 < pNtk->vBoxes->nSize; iVar3 = iVar3 + 1) {
        pAVar7 = Abc_NtkBox(pNtk,iVar3);
        if ((*(uint *)&pAVar7->field_0x14 & 0xf) == 8) {
          plVar1 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray];
          pcVar8 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[6] * 8));
          plVar1 = (long *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray];
          pcVar6 = Abc_ObjName(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)plVar1[4] * 8));
          fprintf(__stream,"%-11s = DFFRSE( %s, gnd, gnd, gnd, gnd )\n",pcVar8,pcVar6);
        }
      }
      vTruth = (Vec_Int_t *)malloc(0x10);
      vTruth->nCap = 10000;
      vTruth->nSize = 0;
      piVar9 = (int *)malloc(40000);
      vTruth->pArray = piVar9;
      p = Extra_ProgressBarStart((FILE *)_stdout,pNtk->vObjs->nSize);
      iVar3 = 0;
LAB_002e3aaa:
      if (pNtk->vObjs->nSize <= iVar3) {
        Extra_ProgressBarStop(p);
        free(vTruth->pArray);
        free(vTruth);
        if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
          puts("Io_WriteBench: EXDC is not written (warning).");
        }
        fclose(__stream);
        return 1;
      }
      pAVar7 = Abc_NtkObj(pNtk,iVar3);
      if ((pAVar7 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar7->field_0x14 & 0xf) == 7)) {
        Extra_ProgressBarUpdate(p,iVar3,pString);
        if ((*(uint *)&pAVar7->field_0x14 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                        ,0x104,"int Io_WriteBenchLutOneNode(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        iVar5 = (pAVar7->vFanins).nSize;
        if (8 < iVar5) {
          __assert_fail("nFanins <= 8",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBench.c"
                        ,0x106,"int Io_WriteBenchLutOneNode(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        Sign = Hop_ManConvertAigToTruth
                         ((Hop_Man_t *)pAVar7->pNtk->pManFunc,
                          (Hop_Obj_t *)((ulong)(pAVar7->field_5).pData & 0xfffffffffffffffe),iVar5,
                          vTruth,0);
        if (((ulong)pAVar7->field_5 & 1) == 0) {
          uVar4 = 1 << ((char)iVar5 - 5U & 0x1f);
        }
        else {
          uVar4 = 1 << ((char)iVar5 - 5U & 0x1f);
          uVar11 = (ulong)uVar4;
          if (iVar5 < 6) {
            uVar11 = 1;
          }
          for (; 0 < (long)uVar11; uVar11 = uVar11 - 1) {
            Sign[uVar11 - 1] = ~Sign[uVar11 - 1];
          }
        }
        uVar10 = (ulong)uVar4;
        uVar11 = (ulong)uVar4;
        if (iVar5 < 6) {
          uVar10 = 1;
          uVar11 = 1;
        }
        do {
          if ((long)uVar10 < 1) {
            pcVar8 = Abc_ObjName((Abc_Obj_t *)
                                 pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray]);
            pcVar6 = "%-11s = gnd\n";
            goto LAB_002e3c57;
          }
          lVar2 = uVar10 - 1;
          uVar10 = uVar10 - 1;
        } while (Sign[lVar2] == 0);
LAB_002e3b62:
        if (0 < (long)uVar11) goto code_r0x002e3b6b;
        pcVar8 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray]);
        pcVar6 = "%-11s = vdd\n";
LAB_002e3c57:
        fprintf(__stream,pcVar6,pcVar8);
      }
      goto LAB_002e3c61;
    }
    pcVar8 = "Io_WriteBench(): Cannot open the output file.\n";
    __size = 0x2e;
  }
  fwrite(pcVar8,__size,1,_stdout);
  return 0;
code_r0x002e3b6b:
  lVar2 = uVar11 - 1;
  uVar11 = uVar11 - 1;
  if (Sign[lVar2] != 0xffffffff) goto code_r0x002e3b76;
  goto LAB_002e3b62;
code_r0x002e3b76:
  pcVar8 = Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanouts).pArray]);
  if (iVar5 == 1) {
    iVar5 = Abc_NodeIsBuf(pAVar7);
    Abc_ObjName((Abc_Obj_t *)pAVar7->pNtk->vObjs->pArray[*(pAVar7->vFanins).pArray]);
    fprintf(__stream,"%-11s = LUT 0x%d ( %s )\n",pcVar8,(ulong)(2 - (iVar5 == 0)));
  }
  else {
    fprintf(__stream,"%-11s = LUT 0x",pcVar8);
    Extra_PrintHexadecimal((FILE *)__stream,Sign,iVar5);
    fwrite(" (",2,1,__stream);
    for (uVar11 = 0; (long)uVar11 < (long)(pAVar7->vFanins).nSize; uVar11 = uVar11 + 1) {
      pcVar8 = Abc_ObjName((Abc_Obj_t *)
                           pAVar7->pNtk->vObjs->pArray[(pAVar7->vFanins).pArray[uVar11]]);
      pcVar6 = ",";
      if (iVar5 - 1 == uVar11) {
        pcVar6 = "";
      }
      fprintf(__stream," %s%s",pcVar8,pcVar6);
    }
    fwrite(" )\n",3,1,__stream);
  }
LAB_002e3c61:
  iVar3 = iVar3 + 1;
  goto LAB_002e3aaa;
}

Assistant:

int Io_WriteBenchLut( Abc_Ntk_t * pNtk, char * pFileName )
{
    Abc_Ntk_t * pExdc;
    FILE * pFile;
    assert( Abc_NtkIsAigNetlist(pNtk) );
    if ( !Io_WriteBenchCheckNames(pNtk) )
    {
        fprintf( stdout, "Io_WriteBenchLut(): Signal names in this benchmark contain parentheses making them impossible to reproduce in the BENCH format. Use \"short_names\".\n" );
        return 0;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBench(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the network
    Io_WriteBenchLutOne( pFile, pNtk );
    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
        printf( "Io_WriteBench: EXDC is not written (warning).\n" );
    // finalize the file
    fclose( pFile );
    return 1;
}